

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void dropColumnFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  short sVar1;
  sqlite3 *db;
  sqlite3_xauth p_Var2;
  int iVar3;
  i64 iVar4;
  char *zSql;
  i64 iVar5;
  RenameToken *pRVar6;
  char *pcVar7;
  char *pcVar8;
  Parse sParse;
  Parse local_1d0;
  
  db = context->pOut->db;
  iVar4 = sqlite3VdbeIntValue(*argv);
  zSql = (char *)sqlite3ValueText(argv[1],'\x01');
  iVar5 = sqlite3VdbeIntValue(argv[2]);
  pcVar7 = db->aDb[(int)iVar4].zDbSName;
  p_Var2 = db->xAuth;
  db->xAuth = (sqlite3_xauth)0x0;
  iVar3 = renameParseSql(&local_1d0,pcVar7,db,zSql,(uint)((int)iVar4 == 1));
  if (iVar3 == 0) {
    if (local_1d0.pNewTable != (Table *)0x0) {
      sVar1 = (local_1d0.pNewTable)->nCol;
      iVar3 = (int)iVar5;
      if (sVar1 != 1 && iVar3 < sVar1) {
        pcVar7 = (local_1d0.pNewTable)->aCol[iVar3].zCnName;
        pRVar6 = local_1d0.pRename;
        if (local_1d0.pRename != (RenameToken *)0x0 && pcVar7 != (char *)0x0) {
          do {
            if ((char *)pRVar6->p == pcVar7) goto LAB_001b9846;
            pRVar6 = pRVar6->pNext;
          } while (pRVar6 != (RenameToken *)0x0);
        }
        pRVar6 = (RenameToken *)0x0;
LAB_001b9846:
        if (iVar3 < sVar1 + -1) {
          for (; (char *)(local_1d0.pRename)->p !=
                 (local_1d0.pNewTable)->aCol[(long)iVar3 + 1].zCnName;
              local_1d0.pRename = (local_1d0.pRename)->pNext) {
          }
          pcVar7 = ((local_1d0.pRename)->t).z;
        }
        else {
          pcVar7 = zSql + ((local_1d0.pNewTable)->u).tab.addColOffset;
          pcVar8 = (pRVar6->t).z;
          while( true ) {
            if ((*pcVar8 == '\0') || (*pcVar8 == ',')) break;
            (pRVar6->t).z = pcVar8 + -1;
            pcVar8 = pcVar8 + -1;
          }
        }
        iVar3 = 0;
        pcVar7 = sqlite3MPrintf(db,"%.*s%s",(long)(pRVar6->t).z - (long)zSql,zSql,pcVar7);
        setResultStrOrError(context,pcVar7,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
        sqlite3_free(pcVar7);
        goto LAB_001b98fb;
      }
    }
    iVar3 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1bbef,
                "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
  }
LAB_001b98fb:
  renameParseCleanup(&local_1d0);
  db->xAuth = p_Var2;
  if (iVar3 != 0) {
    sqlite3_result_error_code(context,iVar3);
  }
  return;
}

Assistant:

static void dropColumnFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  int iSchema = sqlite3_value_int(argv[0]);
  const char *zSql = (const char*)sqlite3_value_text(argv[1]);
  int iCol = sqlite3_value_int(argv[2]);
  const char *zDb = db->aDb[iSchema].zDbSName;
  int rc;
  Parse sParse;
  RenameToken *pCol;
  Table *pTab;
  const char *zEnd;
  char *zNew = 0;

#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
  db->xAuth = 0;
#endif

  UNUSED_PARAMETER(NotUsed);
  rc = renameParseSql(&sParse, zDb, db, zSql, iSchema==1);
  if( rc!=SQLITE_OK ) goto drop_column_done;
  pTab = sParse.pNewTable;
  if( pTab==0 || pTab->nCol==1 || iCol>=pTab->nCol ){
    /* This can happen if the sqlite_schema table is corrupt */
    rc = SQLITE_CORRUPT_BKPT;
    goto drop_column_done;
  }

  pCol = renameTokenFind(&sParse, 0, (void*)pTab->aCol[iCol].zCnName);
  if( iCol<pTab->nCol-1 ){
    RenameToken *pEnd;
    pEnd = renameTokenFind(&sParse, 0, (void*)pTab->aCol[iCol+1].zCnName);
    zEnd = (const char*)pEnd->t.z;
  }else{
    assert( IsOrdinaryTable(pTab) );
    zEnd = (const char*)&zSql[pTab->u.tab.addColOffset];
    while( ALWAYS(pCol->t.z[0]!=0) && pCol->t.z[0]!=',' ) pCol->t.z--;
  }

  zNew = sqlite3MPrintf(db, "%.*s%s", pCol->t.z-zSql, zSql, zEnd);
  sqlite3_result_text(context, zNew, -1, SQLITE_TRANSIENT);
  sqlite3_free(zNew);

drop_column_done:
  renameParseCleanup(&sParse);
#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif
  if( rc!=SQLITE_OK ){
    sqlite3_result_error_code(context, rc);
  }
}